

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

StatsPublisher * anon_unknown.dwarf_17105::createStatsPublisher(Value *v)

{
  return_type rVar1;
  Value *pVVar2;
  invalid_argument *this;
  StatsPublisher *in_RDI;
  Value *sendBuffer;
  Value *bind;
  StatsPublisher *out;
  string *in_stack_00000190;
  Value *in_stack_00000198;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  value_type *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  allocator local_79;
  string local_78 [32];
  Value *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  Value *local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"bind",&local_39);
  pVVar2 = toml::Value::find(in_stack_00000198,in_stack_00000190);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pVVar2;
  if (pVVar2 != (Value *)0x0) {
    local_4d = 0;
    Config::StatsPublisher::StatsPublisher
              ((StatsPublisher *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    toml::Value::as<std::__cxx11::string>
              ((Value *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"send_buffer",&local_79);
    pVVar2 = toml::Value::find(in_stack_00000198,in_stack_00000190);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if (pVVar2 != (Value *)0x0) {
      local_58 = pVVar2;
      rVar1 = toml::Value::as<int>
                        ((Value *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      in_RDI->sendBuffer = (long)rVar1;
    }
    return in_RDI;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected publisher section to have \"bind\" key");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Config::StatsPublisher createStatsPublisher(const toml::Value& v) {
  auto bind = v.find("bind");
  if (!bind) {
    throw std::invalid_argument(
        "Expected publisher section to have \"bind\" key");
  }

  Config::StatsPublisher out;
  out.bind.push_back(bind->as<std::string>());

  // Optional send buffer size
  auto sendBuffer = v.find("send_buffer");
  if (sendBuffer) {
    out.sendBuffer = sendBuffer->as<int>();
  }

  return out;
}